

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O1

void __thiscall
gss::innards::Proof::emit_hall_set_or_violator
          (Proof *this,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *lhs,vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *rhs)

{
  long *plVar1;
  pointer ppVar2;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar3;
  ostream *poVar4;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *r_2;
  pointer ppVar5;
  map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_00;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *l;
  bool bVar6;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1_1;
  long local_40;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  local_38 = rhs;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"* hall set or violator {",0x18);
  ppVar2 = (lhs->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (lhs->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
    uVar3._M_t.
    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream).
           _M_t;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar3._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar3._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,(ppVar5->second)._M_dataplus._M_p,(ppVar5->second)._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t," } / {",6);
  ppVar2 = (local_38->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (local_38->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
    uVar3._M_t.
    super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
    .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>._M_head_impl
         = (((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream).
           _M_t;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar3._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               uVar3._M_t.
               super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,(ppVar5->second)._M_dataplus._M_p,(ppVar5->second)._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t," }\n",3);
  if (((this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->recover_encoding !=
      false) {
    ppVar2 = (local_38->
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar5 = (local_38->
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1)
    {
      recover_injectivity_constraint(this,ppVar5->first);
    }
    ppVar2 = (lhs->
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar5 = (lhs->
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1)
    {
      recover_at_least_one_constraint(this,ppVar5->first);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t,"p",1);
  ppVar5 = (lhs->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (lhs->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar2) {
    bVar6 = true;
    do {
      uVar3._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar3._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl," ",1);
      this_00 = &((this->_imp)._M_t.
                  super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                  .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                 at_least_one_value_constraints;
      if (bVar6) {
        local_40 = (long)ppVar5->first;
        std::
        map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[](this_00,&local_40);
        std::ostream::_M_insert<long>
                  ((long)uVar3._M_t.
                         super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                         ._M_head_impl);
        bVar6 = false;
      }
      else {
        local_40 = (long)ppVar5->first;
        std::
        map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[](this_00,&local_40);
        poVar4 = std::ostream::_M_insert<long>
                           ((long)uVar3._M_t.
                                  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                  ._M_head_impl);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," +",2);
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar2);
  }
  ppVar5 = (local_38->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (local_38->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar2) {
    do {
      uVar3._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 uVar3._M_t.
                 super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl," ",1);
      local_40 = (long)ppVar5->first;
      std::
      map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator[](&((this->_imp)._M_t.
                     super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                     .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                    injectivity_constraints,&local_40);
      poVar4 = std::ostream::_M_insert<long>
                         ((long)uVar3._M_t.
                                super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                                ._M_head_impl);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," +",2);
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_stream
             )._M_t," 0\n",3);
  plVar1 = &((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  return;
}

Assistant:

auto Proof::emit_hall_set_or_violator(const vector<NamedVertex> & lhs, const vector<NamedVertex> & rhs) -> void
{
    *_imp->proof_stream << "* hall set or violator {";
    for (auto & l : lhs)
        *_imp->proof_stream << " " << l.second;
    *_imp->proof_stream << " } / {";
    for (auto & r : rhs)
        *_imp->proof_stream << " " << r.second;
    *_imp->proof_stream << " }\n";

    if (_imp->recover_encoding) {
        for (auto & r : rhs)
            recover_injectivity_constraint(r.first);
        for (auto & l : lhs)
            recover_at_least_one_constraint(l.first);
    }

    *_imp->proof_stream << "p";
    bool first = true;
    for (auto & l : lhs) {
        if (first) {
            first = false;
            *_imp->proof_stream << " " << get<1>(_imp->at_least_one_value_constraints[l.first]);
        }
        else
            *_imp->proof_stream << " " << get<1>(_imp->at_least_one_value_constraints[l.first]) << " +";
    }
    for (auto & r : rhs)
        *_imp->proof_stream << " " << get<1>(_imp->injectivity_constraints[r.first]) << " +";
    *_imp->proof_stream << " 0\n";
    ++_imp->proof_line;
}